

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void flatcc_json_printer_char_array_struct_field
               (flatcc_json_printer_t *ctx,int index,void *p,size_t offset,char *name,size_t len,
               size_t count)

{
  char *pcVar1;
  byte *pbVar2;
  ulong __n;
  ulong uVar3;
  byte *__src;
  byte *pbVar4;
  byte c;
  size_t __n_00;
  bool bVar5;
  
  if (index != 0) {
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + 1;
    *pcVar1 = ',';
  }
  __src = (byte *)((long)p + offset);
  print_name(ctx,name,len);
  if (count != 0) {
    do {
      if (__src[count - 1] != 0) goto LAB_0012809a;
      count = count - 1;
    } while (count != 0);
    count = 0;
  }
LAB_0012809a:
  pcVar1 = ctx->p;
  ctx->p = pcVar1 + 1;
  *pcVar1 = '\"';
  c = 0;
  pbVar4 = __src;
  do {
    bVar5 = count == 0;
    if (!bVar5) {
      c = *pbVar4;
      if (c < 0x20) {
        bVar5 = false;
      }
      else {
        pbVar2 = pbVar4 + count;
        bVar5 = false;
        do {
          if ((c == 0x22) || (c == 0x5c)) break;
          bVar5 = count == 1;
          if (bVar5) {
            count = 0;
            pbVar4 = pbVar2;
            break;
          }
          c = pbVar4[1];
          pbVar4 = pbVar4 + 1;
          count = count - 1;
        } while (0x1f < c);
      }
    }
    __n = (long)pbVar4 - (long)__src;
    pcVar1 = ctx->p;
    uVar3 = __n;
    if (pcVar1 + __n < ctx->pflush) {
      memcpy(pcVar1,__src,__n);
    }
    else {
      if (ctx->pflush <= pcVar1) {
        (*ctx->flush)(ctx,0);
      }
      __n_00 = (long)ctx->pflush - (long)ctx->p;
      pbVar2 = __src;
      if (__n_00 < __n) {
        do {
          memcpy(ctx->p,pbVar2,__n_00);
          ctx->p = ctx->p + __n_00;
          pbVar2 = pbVar2 + __n_00;
          uVar3 = uVar3 - __n_00;
          (*ctx->flush)(ctx,0);
          __n_00 = (long)ctx->pflush - (long)ctx->p;
        } while (__n_00 < uVar3);
      }
      memcpy(ctx->p,pbVar2,uVar3);
    }
    pcVar1 = ctx->p;
    ctx->p = pcVar1 + uVar3;
    if (bVar5) {
      pcVar1 = pcVar1 + uVar3;
      ctx->p = pcVar1 + 1;
      *pcVar1 = '\"';
      return;
    }
    print_escape(ctx,c);
    pbVar4 = pbVar4 + 1;
    count = count - 1;
    __src = __src + __n + 1;
  } while( true );
}

Assistant:

void flatcc_json_printer_char_array_struct_field(
        flatcc_json_printer_t *ctx,
        int index, const void *p, size_t offset,
        const char *name, size_t len, size_t count)
{
    p = (void *)((size_t)p + offset);
    if (index) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_char_array(ctx, p, count);
}